

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frame_enc.c
# Opt level: O2

int VP8EncTokenLoop(VP8Encoder *enc)

{
  VP8EncProba *proba;
  VP8TBuffer *b;
  ProbaArray (*probas) [8];
  int iVar1;
  VP8RDLevel rd_opt;
  int iVar2;
  float q;
  VP8Encoder *enc_00;
  int iVar3;
  int iVar4;
  int iVar5;
  ulong uVar6;
  size_t sVar7;
  int iVar8;
  int iVar9;
  long lVar10;
  int16_t (*paiVar11) [16];
  int16_t (*paiVar12) [16];
  long lVar13;
  int iVar14;
  uint ok;
  int *piVar15;
  long lVar16;
  ulong uVar17;
  ulong uVar18;
  bool bVar19;
  bool bVar20;
  float fVar21;
  double dVar22;
  uint64_t local_1378;
  long local_1370;
  int16_t (*local_1338) [16];
  PassStats local_1310;
  VP8Residual local_12d8;
  VP8ModeScore info;
  VP8EncIterator it;
  
  iVar5 = enc->mb_w_;
  iVar8 = enc->mb_h_;
  iVar14 = enc->config_->pass;
  iVar1 = enc->do_search_;
  rd_opt = enc->rd_opt_level_;
  InitPassStats(enc,&local_1310);
  iVar3 = PreLoopInitialize(enc);
  if (iVar3 == 0) {
    iVar5 = 0;
  }
  else {
    lVar10 = (long)iVar8 * (long)iVar5;
    iVar8 = (int)lVar10 >> 3;
    iVar5 = 0x60;
    if (0x60 < iVar8) {
      iVar5 = iVar8;
    }
    proba = &enc->proba_;
    b = &enc->tokens_;
    probas = (enc->proba_).coeffs_;
    while( true ) {
      iVar8 = local_1310.do_size_search;
      q = local_1310.q;
      fVar21 = ABS(local_1310.dq);
      iVar3 = iVar14 + -1;
      dVar22 = local_1310.value;
      while( true ) {
        iVar4 = local_1310.do_size_search;
        if (iVar14 < 1) goto LAB_00124735;
        bVar19 = true;
        if (iVar3 != 0 && 0.4 < fVar21) {
          bVar19 = enc->max_i4_header_bits_ == 0;
        }
        VP8IteratorInit(enc,&it);
        SetLoopParams(enc,q);
        if (bVar19) {
          memset((enc->proba_).stats_,0,0x1080);
          VP8InitFilter(&it);
        }
        VP8TBufferClear(b);
        local_1370 = 0;
        local_1378 = 0;
        iVar4 = iVar5;
        do {
          VP8IteratorImport(&it,(uint8_t *)0x0);
          if (iVar4 < 1) {
            FinalizeTokenProbas(proba);
            VP8CalculateLevelCosts(proba);
            iVar4 = iVar5;
          }
          else {
            iVar4 = iVar4 + -1;
          }
          VP8Decimate(&it,&info,rd_opt);
          enc_00 = it.enc_;
          VP8IteratorNzToBytes(&it);
          bVar20 = ((uint)*it.mb_ & 3) != 1;
          if (bVar20) {
            iVar9 = 3;
          }
          else {
            iVar9 = it.left_nz_[8] + it.top_nz_[8];
            VP8InitResidual(0,1,enc_00,&local_12d8);
            (*VP8SetResidualCoeffs)(info.y_dc_levels,&local_12d8);
            it.top_nz_[8] = VP8RecordCoeffTokens(iVar9,&local_12d8,b);
            iVar9 = 0;
            it.left_nz_[8] = it.top_nz_[8];
          }
          VP8InitResidual((uint)!bVar20,iVar9,enc_00,&local_12d8);
          paiVar11 = info.y_ac_levels;
          for (lVar13 = 0; lVar13 != 4; lVar13 = lVar13 + 1) {
            paiVar12 = paiVar11;
            for (lVar16 = 0; lVar16 != 4; lVar16 = lVar16 + 1) {
              iVar9 = it.left_nz_[lVar13];
              iVar2 = it.top_nz_[lVar16];
              (*VP8SetResidualCoeffs)(*paiVar12,&local_12d8);
              iVar9 = VP8RecordCoeffTokens(iVar9 + iVar2,&local_12d8,b);
              it.left_nz_[lVar13] = iVar9;
              it.top_nz_[lVar16] = iVar9;
              paiVar12 = paiVar12 + 1;
            }
            paiVar11 = paiVar11 + 4;
          }
          VP8InitResidual(0,2,enc_00,&local_12d8);
          piVar15 = it.top_nz_ + 4;
          local_1338 = info.uv_levels;
          for (uVar6 = 0; uVar6 < 3; uVar6 = uVar6 + 2) {
            paiVar11 = local_1338;
            for (uVar18 = 0; uVar18 != 2; uVar18 = uVar18 + 1) {
              uVar17 = uVar18 | uVar6 | 4;
              paiVar12 = paiVar11;
              for (lVar13 = 0; lVar13 != 2; lVar13 = lVar13 + 1) {
                iVar9 = it.left_nz_[uVar17];
                iVar2 = piVar15[lVar13];
                (*VP8SetResidualCoeffs)(*paiVar12,&local_12d8);
                iVar9 = VP8RecordCoeffTokens(iVar9 + iVar2,&local_12d8,b);
                it.left_nz_[uVar17] = iVar9;
                piVar15[lVar13] = iVar9;
                paiVar12 = paiVar12 + 1;
              }
              paiVar11 = paiVar11 + 2;
            }
            local_1338 = local_1338 + 4;
            piVar15 = piVar15 + 2;
          }
          VP8IteratorBytesToNz(&it);
          if ((enc->tokens_).error_ != 0) {
            local_1310.value = dVar22;
            WebPEncodingSetError(enc->pic_,VP8_ENC_ERROR_OUT_OF_MEMORY);
            dVar22 = local_1310.value;
            goto LAB_00124704;
          }
          local_1370 = local_1370 + info.H;
          local_1378 = local_1378 + info.D;
          if (bVar19) {
            StoreSideInfo(&it);
            VP8StoreFilterStats(&it);
            VP8IteratorExport(&it);
            iVar9 = VP8IteratorProgress(&it,0x14);
            VP8IteratorSaveBoundary(&it);
            if (iVar9 == 0) goto LAB_00124704;
          }
          else {
            VP8IteratorSaveBoundary(&it);
          }
          iVar9 = VP8IteratorNext(&it);
        } while (iVar9 != 0);
        uVar6 = local_1370 + (enc->segment_hdr_).size_;
        if (iVar8 == 0) {
          dVar22 = GetPSNR(local_1378,lVar10 * 0x180);
        }
        else {
          iVar4 = FinalizeTokenProbas(proba);
          sVar7 = VP8EstimateTokenSize(b,(uint8_t *)probas);
          dVar22 = (double)((sVar7 + (long)iVar4 + uVar6 + 0x400 >> 0xb) + 0x1e);
        }
        if ((enc->max_i4_header_bits_ < 1) || (uVar6 < 0x3fc00001)) break;
        enc->max_i4_header_bits_ = (uint)enc->max_i4_header_bits_ >> 1;
        if (bVar19) {
          if ((it.enc_)->pic_->stats != (WebPAuxStats *)0x0) {
            (it.enc_)->block_count_[2] = 0;
            (it.enc_)->block_count_[0] = 0;
            (it.enc_)->block_count_[1] = 0;
          }
          (it.enc_)->sse_count_ = 0;
          (it.enc_)->sse_[0] = 0;
          (it.enc_)->sse_[1] = 0;
          (it.enc_)->sse_[2] = 0;
        }
      }
      iVar4 = iVar8;
      if (bVar19) break;
      local_1310.value = dVar22;
      iVar14 = iVar3;
      if (iVar1 != 0) {
        ComputeNextQ(&local_1310);
      }
    }
LAB_00124735:
    local_1310.value = dVar22;
    if (iVar4 == 0) {
      FinalizeTokenProbas(proba);
    }
    iVar5 = VP8EmitTokens(b,enc->parts_,(uint8_t *)probas,1);
    dVar22 = local_1310.value;
    if (iVar5 == 0) {
LAB_00124704:
      local_1310.value = dVar22;
      ok = 0;
    }
    else {
      iVar5 = WebPReportProgress(enc->pic_,enc->percent_ + 0x14,&enc->percent_);
      ok = (uint)(iVar5 != 0);
    }
    iVar5 = PostLoopFinalize(&it,ok);
  }
  return iVar5;
}

Assistant:

int VP8EncTokenLoop(VP8Encoder* const enc) {
  // Roughly refresh the proba eight times per pass
  int max_count = (enc->mb_w_ * enc->mb_h_) >> 3;
  int num_pass_left = enc->config_->pass;
  const int do_search = enc->do_search_;
  VP8EncIterator it;
  VP8EncProba* const proba = &enc->proba_;
  const VP8RDLevel rd_opt = enc->rd_opt_level_;
  const uint64_t pixel_count = enc->mb_w_ * enc->mb_h_ * 384;
  PassStats stats;
  int ok;

  InitPassStats(enc, &stats);
  ok = PreLoopInitialize(enc);
  if (!ok) return 0;

  if (max_count < MIN_COUNT) max_count = MIN_COUNT;

  assert(enc->num_parts_ == 1);
  assert(enc->use_tokens_);
  assert(proba->use_skip_proba_ == 0);
  assert(rd_opt >= RD_OPT_BASIC);   // otherwise, token-buffer won't be useful
  assert(num_pass_left > 0);

  while (ok && num_pass_left-- > 0) {
    const int is_last_pass = (fabs(stats.dq) <= DQ_LIMIT) ||
                             (num_pass_left == 0) ||
                             (enc->max_i4_header_bits_ == 0);
    uint64_t size_p0 = 0;
    uint64_t distortion = 0;
    int cnt = max_count;
    VP8IteratorInit(enc, &it);
    SetLoopParams(enc, stats.q);
    if (is_last_pass) {
      ResetTokenStats(enc);
      VP8InitFilter(&it);  // don't collect stats until last pass (too costly)
    }
    VP8TBufferClear(&enc->tokens_);
    do {
      VP8ModeScore info;
      VP8IteratorImport(&it, NULL);
      if (--cnt < 0) {
        FinalizeTokenProbas(proba);
        VP8CalculateLevelCosts(proba);  // refresh cost tables for rd-opt
        cnt = max_count;
      }
      VP8Decimate(&it, &info, rd_opt);
      ok = RecordTokens(&it, &info, &enc->tokens_);
      if (!ok) {
        WebPEncodingSetError(enc->pic_, VP8_ENC_ERROR_OUT_OF_MEMORY);
        break;
      }
      size_p0 += info.H;
      distortion += info.D;
      if (is_last_pass) {
        StoreSideInfo(&it);
        VP8StoreFilterStats(&it);
        VP8IteratorExport(&it);
        ok = VP8IteratorProgress(&it, 20);
      }
      VP8IteratorSaveBoundary(&it);
    } while (ok && VP8IteratorNext(&it));
    if (!ok) break;

    size_p0 += enc->segment_hdr_.size_;
    if (stats.do_size_search) {
      uint64_t size = FinalizeTokenProbas(&enc->proba_);
      size += VP8EstimateTokenSize(&enc->tokens_,
                                   (const uint8_t*)proba->coeffs_);
      size = (size + size_p0 + 1024) >> 11;  // -> size in bytes
      size += HEADER_SIZE_ESTIMATE;
      stats.value = (double)size;
    } else {  // compute and store PSNR
      stats.value = GetPSNR(distortion, pixel_count);
    }

#if (DEBUG_SEARCH > 0)
    printf("#%2d metric:%.1lf -> %.1lf   last_q=%.2lf q=%.2lf dq=%.2lf "
           " range:[%.1f, %.1f]\n",
           num_pass_left, stats.last_value, stats.value,
           stats.last_q, stats.q, stats.dq, stats.qmin, stats.qmax);
#endif
    if (enc->max_i4_header_bits_ > 0 && size_p0 > PARTITION0_SIZE_LIMIT) {
      ++num_pass_left;
      enc->max_i4_header_bits_ >>= 1;  // strengthen header bit limitation...
      if (is_last_pass) {
        ResetSideInfo(&it);
      }
      continue;                        // ...and start over
    }
    if (is_last_pass) {
      break;   // done
    }
    if (do_search) {
      ComputeNextQ(&stats);  // Adjust q
    }
  }
  if (ok) {
    if (!stats.do_size_search) {
      FinalizeTokenProbas(&enc->proba_);
    }
    ok = VP8EmitTokens(&enc->tokens_, enc->parts_ + 0,
                       (const uint8_t*)proba->coeffs_, 1);
  }
  ok = ok && WebPReportProgress(enc->pic_, enc->percent_ + 20, &enc->percent_);
  return PostLoopFinalize(&it, ok);
}